

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

bool __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::ensureHighStart(MutableCodePointTrie *this,UChar32 c)

{
  uint32_t *__src;
  uint32_t *__dest;
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (this->highStart <= c) {
    uVar2 = (c & 0xfffffe00U) + 0x200;
    iVar4 = this->highStart >> 4;
    uVar3 = uVar2 >> 4;
    if (this->indexCapacity < (int)uVar3) {
      __dest = (uint32_t *)uprv_malloc_63(0x44000);
      if (__dest == (uint32_t *)0x0) {
        return false;
      }
      __src = this->index;
      memcpy(__dest,__src,(long)(iVar4 * 4));
      uprv_free_63(__src);
      this->index = __dest;
      this->indexCapacity = 0x11000;
    }
    lVar1 = (long)iVar4;
    do {
      this->flags[lVar1] = '\0';
      this->index[lVar1] = this->initialValue;
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)(ulong)uVar3);
    this->highStart = uVar2;
  }
  return true;
}

Assistant:

bool MutableCodePointTrie::ensureHighStart(UChar32 c) {
    if (c >= highStart) {
        // Round up to a UCPTRIE_CP_PER_INDEX_2_ENTRY boundary to simplify compaction.
        c = (c + UCPTRIE_CP_PER_INDEX_2_ENTRY) & ~(UCPTRIE_CP_PER_INDEX_2_ENTRY - 1);
        int32_t i = highStart >> UCPTRIE_SHIFT_3;
        int32_t iLimit = c >> UCPTRIE_SHIFT_3;
        if (iLimit > indexCapacity) {
            uint32_t *newIndex = (uint32_t *)uprv_malloc(I_LIMIT * 4);
            if (newIndex == nullptr) { return false; }
            uprv_memcpy(newIndex, index, i * 4);
            uprv_free(index);
            index = newIndex;
            indexCapacity = I_LIMIT;
        }
        do {
            flags[i] = ALL_SAME;
            index[i] = initialValue;
        } while(++i < iLimit);
        highStart = c;
    }
    return true;
}